

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  Geometry *this;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  bool bVar35;
  bool bVar36;
  int iVar37;
  AABBNodeMB4D *node1;
  ulong uVar38;
  long lVar39;
  ulong *puVar40;
  byte bVar41;
  size_t i;
  long lVar42;
  long lVar43;
  byte bVar44;
  ulong uVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar48 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370[0] = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar64 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar7 = (context->query_radius).field_0;
    auVar63 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar64 = ZEXT1664(auVar63);
  }
  puVar40 = local_2368;
  fVar2 = *(float *)&(query->p).field_0;
  fVar3 = *(float *)((long)&(query->p).field_0 + 4);
  fVar4 = *(float *)((long)&(query->p).field_0 + 8);
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar54._4_4_ = uVar5;
  auVar54._0_4_ = uVar5;
  auVar54._8_4_ = uVar5;
  auVar54._12_4_ = uVar5;
  auVar54._16_4_ = uVar5;
  auVar54._20_4_ = uVar5;
  auVar54._24_4_ = uVar5;
  auVar54._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar57._4_4_ = uVar5;
  auVar57._0_4_ = uVar5;
  auVar57._8_4_ = uVar5;
  auVar57._12_4_ = uVar5;
  auVar57._16_4_ = uVar5;
  auVar57._20_4_ = uVar5;
  auVar57._24_4_ = uVar5;
  auVar57._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar49._4_4_ = uVar5;
  auVar49._0_4_ = uVar5;
  auVar49._8_4_ = uVar5;
  auVar49._12_4_ = uVar5;
  auVar49._16_4_ = uVar5;
  auVar49._20_4_ = uVar5;
  auVar49._24_4_ = uVar5;
  auVar49._28_4_ = uVar5;
  bVar36 = false;
  auVar19 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar65 = ZEXT3264(auVar19);
  auVar66 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar19._4_4_ = fVar2;
    auVar19._0_4_ = fVar2;
    auVar19._8_4_ = fVar2;
    auVar19._12_4_ = fVar2;
    auVar19._16_4_ = fVar2;
    auVar19._20_4_ = fVar2;
    auVar19._24_4_ = fVar2;
    auVar19._28_4_ = fVar2;
    auVar19 = vsubps_avx(auVar19,auVar54);
    fVar9 = auVar54._0_4_;
    fVar10 = auVar54._4_4_;
    fVar11 = auVar54._8_4_;
    fVar12 = auVar54._12_4_;
    fVar13 = auVar54._16_4_;
    fVar14 = auVar54._20_4_;
    fVar15 = auVar54._24_4_;
    auVar16._4_4_ = fVar3;
    auVar16._0_4_ = fVar3;
    auVar16._8_4_ = fVar3;
    auVar16._12_4_ = fVar3;
    auVar16._16_4_ = fVar3;
    auVar16._20_4_ = fVar3;
    auVar16._24_4_ = fVar3;
    auVar16._28_4_ = fVar3;
    auVar16 = vsubps_avx(auVar16,auVar57);
    auVar17._4_4_ = fVar4;
    auVar17._0_4_ = fVar4;
    auVar17._8_4_ = fVar4;
    auVar17._12_4_ = fVar4;
    auVar17._16_4_ = fVar4;
    auVar17._20_4_ = fVar4;
    auVar17._24_4_ = fVar4;
    auVar17._28_4_ = fVar4;
    auVar17 = vsubps_avx(auVar17,auVar49);
    auVar58._0_4_ = fVar4 + auVar49._0_4_;
    auVar58._4_4_ = fVar4 + auVar49._4_4_;
    auVar58._8_4_ = fVar4 + auVar49._8_4_;
    auVar58._12_4_ = fVar4 + auVar49._12_4_;
    auVar58._16_4_ = fVar4 + auVar49._16_4_;
    auVar58._20_4_ = fVar4 + auVar49._20_4_;
    auVar58._24_4_ = fVar4 + auVar49._24_4_;
    auVar58._28_4_ = fVar4 + auVar49._28_4_;
    auVar63 = auVar64._0_16_;
    do {
      do {
        do {
          if (puVar40 == &local_2378) {
            return bVar36;
          }
          pfVar1 = (float *)(puVar40 + -1);
          puVar40 = puVar40 + -2;
        } while (auVar64._0_4_ < *pfVar1);
        uVar45 = *puVar40;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar45 & 8) == 0) {
              uVar38 = uVar45 & 0xfffffffffffffff0;
              fVar6 = query->time;
              auVar55._4_4_ = fVar6;
              auVar55._0_4_ = fVar6;
              auVar55._8_4_ = fVar6;
              auVar55._12_4_ = fVar6;
              auVar55._16_4_ = fVar6;
              auVar55._20_4_ = fVar6;
              auVar55._24_4_ = fVar6;
              auVar55._28_4_ = fVar6;
              auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100),auVar55,
                                        *(undefined1 (*) [32])(uVar38 + 0x40));
              auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x140),auVar55,
                                        *(undefined1 (*) [32])(uVar38 + 0x80));
              auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x180),auVar55,
                                        *(undefined1 (*) [32])(uVar38 + 0xc0));
              auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x120),auVar55,
                                        *(undefined1 (*) [32])(uVar38 + 0x60));
              auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x160),auVar55,
                                        *(undefined1 (*) [32])(uVar38 + 0xa0));
              auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x1a0),auVar55,
                                        *(undefined1 (*) [32])(uVar38 + 0xe0));
              auVar33._4_4_ = fVar2;
              auVar33._0_4_ = fVar2;
              auVar33._8_4_ = fVar2;
              auVar33._12_4_ = fVar2;
              auVar33._16_4_ = fVar2;
              auVar33._20_4_ = fVar2;
              auVar33._24_4_ = fVar2;
              auVar33._28_4_ = fVar2;
              auVar49 = vmaxps_avx(auVar33,ZEXT1632(auVar27));
              auVar49 = vminps_avx(auVar49,ZEXT1632(auVar30));
              auVar18 = vsubps_avx(auVar49,auVar33);
              auVar50._4_4_ = fVar3;
              auVar50._0_4_ = fVar3;
              auVar50._8_4_ = fVar3;
              auVar50._12_4_ = fVar3;
              auVar50._16_4_ = fVar3;
              auVar50._20_4_ = fVar3;
              auVar50._24_4_ = fVar3;
              auVar50._28_4_ = fVar3;
              auVar49 = vmaxps_avx(auVar50,ZEXT1632(auVar28));
              auVar49 = vminps_avx(auVar49,ZEXT1632(auVar31));
              auVar46 = vsubps_avx(auVar49,auVar50);
              auVar51._4_4_ = fVar4;
              auVar51._0_4_ = fVar4;
              auVar51._8_4_ = fVar4;
              auVar51._12_4_ = fVar4;
              auVar51._16_4_ = fVar4;
              auVar51._20_4_ = fVar4;
              auVar51._24_4_ = fVar4;
              auVar51._28_4_ = fVar4;
              auVar49 = vmaxps_avx(auVar51,ZEXT1632(auVar29));
              auVar49 = vminps_avx(auVar49,ZEXT1632(auVar32));
              auVar49 = vsubps_avx(auVar49,auVar51);
              auVar61._0_4_ =
                   auVar18._0_4_ * auVar18._0_4_ + auVar46._0_4_ * auVar46._0_4_ +
                   auVar49._0_4_ * auVar49._0_4_;
              auVar61._4_4_ =
                   auVar18._4_4_ * auVar18._4_4_ + auVar46._4_4_ * auVar46._4_4_ +
                   auVar49._4_4_ * auVar49._4_4_;
              auVar61._8_4_ =
                   auVar18._8_4_ * auVar18._8_4_ + auVar46._8_4_ * auVar46._8_4_ +
                   auVar49._8_4_ * auVar49._8_4_;
              auVar61._12_4_ =
                   auVar18._12_4_ * auVar18._12_4_ + auVar46._12_4_ * auVar46._12_4_ +
                   auVar49._12_4_ * auVar49._12_4_;
              auVar61._16_4_ =
                   auVar18._16_4_ * auVar18._16_4_ + auVar46._16_4_ * auVar46._16_4_ +
                   auVar49._16_4_ * auVar49._16_4_;
              auVar61._20_4_ =
                   auVar18._20_4_ * auVar18._20_4_ + auVar46._20_4_ * auVar46._20_4_ +
                   auVar49._20_4_ * auVar49._20_4_;
              auVar61._24_4_ =
                   auVar18._24_4_ * auVar18._24_4_ + auVar46._24_4_ * auVar46._24_4_ +
                   auVar49._24_4_ * auVar49._24_4_;
              auVar61._28_4_ = auVar46._28_4_ + 0.0 + auVar49._28_4_;
              in_ZMM7 = ZEXT3264(auVar61);
              auVar34._4_4_ = fVar10 * fVar10;
              auVar34._0_4_ = fVar9 * fVar9;
              auVar34._8_4_ = fVar11 * fVar11;
              auVar34._12_4_ = fVar12 * fVar12;
              auVar34._16_4_ = fVar13 * fVar13;
              auVar34._20_4_ = fVar14 * fVar14;
              auVar34._24_4_ = fVar15 * fVar15;
              auVar34._28_4_ = auVar54._28_4_;
              uVar20 = vcmpps_avx512vl(auVar61,auVar34,2);
              uVar21 = vcmpps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar30),2);
              bVar44 = (byte)uVar20 & (byte)uVar21;
              if (((uint)uVar45 & 7) == 6) {
                uVar20 = vcmpps_avx512vl(auVar55,*(undefined1 (*) [32])(uVar38 + 0x1c0),0xd);
                uVar21 = vcmpps_avx512vl(auVar55,*(undefined1 (*) [32])(uVar38 + 0x1e0),1);
                bVar44 = (byte)uVar20 & (byte)uVar21 & bVar44;
              }
              This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),(uint)bVar44);
            }
          }
          else if ((uVar45 & 8) == 0) {
            uVar38 = uVar45 & 0xfffffffffffffff0;
            fVar6 = query->time;
            auVar56._4_4_ = fVar6;
            auVar56._0_4_ = fVar6;
            auVar56._8_4_ = fVar6;
            auVar56._12_4_ = fVar6;
            auVar56._16_4_ = fVar6;
            auVar56._20_4_ = fVar6;
            auVar56._24_4_ = fVar6;
            auVar56._28_4_ = fVar6;
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x100),auVar56,
                                      *(undefined1 (*) [32])(uVar38 + 0x40));
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x140),auVar56,
                                      *(undefined1 (*) [32])(uVar38 + 0x80));
            auVar29 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x180),auVar56,
                                      *(undefined1 (*) [32])(uVar38 + 0xc0));
            auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x120),auVar56,
                                      *(undefined1 (*) [32])(uVar38 + 0x60));
            auVar31 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x160),auVar56,
                                      *(undefined1 (*) [32])(uVar38 + 0xa0));
            auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar38 + 0x1a0),auVar56,
                                      *(undefined1 (*) [32])(uVar38 + 0xe0));
            auVar18._4_4_ = fVar2;
            auVar18._0_4_ = fVar2;
            auVar18._8_4_ = fVar2;
            auVar18._12_4_ = fVar2;
            auVar18._16_4_ = fVar2;
            auVar18._20_4_ = fVar2;
            auVar18._24_4_ = fVar2;
            auVar18._28_4_ = fVar2;
            auVar49 = vmaxps_avx(auVar18,ZEXT1632(auVar27));
            auVar49 = vminps_avx(auVar49,ZEXT1632(auVar30));
            auVar18 = vsubps_avx(auVar49,auVar18);
            auVar46._4_4_ = fVar3;
            auVar46._0_4_ = fVar3;
            auVar46._8_4_ = fVar3;
            auVar46._12_4_ = fVar3;
            auVar46._16_4_ = fVar3;
            auVar46._20_4_ = fVar3;
            auVar46._24_4_ = fVar3;
            auVar46._28_4_ = fVar3;
            auVar49 = vmaxps_avx(auVar46,ZEXT1632(auVar28));
            auVar49 = vminps_avx(auVar49,ZEXT1632(auVar31));
            auVar46 = vsubps_avx(auVar49,auVar46);
            auVar47._4_4_ = fVar4;
            auVar47._0_4_ = fVar4;
            auVar47._8_4_ = fVar4;
            auVar47._12_4_ = fVar4;
            auVar47._16_4_ = fVar4;
            auVar47._20_4_ = fVar4;
            auVar47._24_4_ = fVar4;
            auVar47._28_4_ = fVar4;
            auVar49 = vmaxps_avx(auVar47,ZEXT1632(auVar29));
            auVar49 = vminps_avx(auVar49,ZEXT1632(auVar32));
            auVar49 = vsubps_avx(auVar49,auVar47);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar46._28_4_ + auVar46._28_4_ + auVar18._28_4_,
                                         CONCAT424(auVar49._24_4_ * auVar49._24_4_ +
                                                   auVar46._24_4_ * auVar46._24_4_ +
                                                   auVar18._24_4_ * auVar18._24_4_,
                                                   CONCAT420(auVar49._20_4_ * auVar49._20_4_ +
                                                             auVar46._20_4_ * auVar46._20_4_ +
                                                             auVar18._20_4_ * auVar18._20_4_,
                                                             CONCAT416(auVar49._16_4_ *
                                                                       auVar49._16_4_ +
                                                                       auVar46._16_4_ *
                                                                       auVar46._16_4_ +
                                                                       auVar18._16_4_ *
                                                                       auVar18._16_4_,
                                                                       CONCAT412(auVar49._12_4_ *
                                                                                 auVar49._12_4_ +
                                                                                 auVar46._12_4_ *
                                                                                 auVar46._12_4_ +
                                                                                 auVar18._12_4_ *
                                                                                 auVar18._12_4_,
                                                                                 CONCAT48(auVar49.
                                                  _8_4_ * auVar49._8_4_ +
                                                  auVar46._8_4_ * auVar46._8_4_ +
                                                  auVar18._8_4_ * auVar18._8_4_,
                                                  CONCAT44(auVar49._4_4_ * auVar49._4_4_ +
                                                           auVar46._4_4_ * auVar46._4_4_ +
                                                           auVar18._4_4_ * auVar18._4_4_,
                                                           auVar49._0_4_ * auVar49._0_4_ +
                                                           auVar46._0_4_ * auVar46._0_4_ +
                                                           auVar18._0_4_ * auVar18._0_4_))))))));
            uVar20 = vcmpps_avx512vl(ZEXT1632(auVar27),ZEXT1632(auVar30),2);
            uVar21 = vcmpps_avx512vl(ZEXT1632(auVar30),auVar19,1);
            auVar52._4_4_ = fVar2 + fVar10;
            auVar52._0_4_ = fVar2 + fVar9;
            auVar52._8_4_ = fVar2 + fVar11;
            auVar52._12_4_ = fVar2 + fVar12;
            auVar52._16_4_ = fVar2 + fVar13;
            auVar52._20_4_ = fVar2 + fVar14;
            auVar52._24_4_ = fVar2 + fVar15;
            auVar52._28_4_ = fVar2 + auVar54._28_4_;
            uVar22 = vcmpps_avx512vl(ZEXT1632(auVar27),auVar52,6);
            uVar23 = vcmpps_avx512vl(ZEXT1632(auVar31),auVar16,1);
            auVar62._4_4_ = fVar3 + auVar57._4_4_;
            auVar62._0_4_ = fVar3 + auVar57._0_4_;
            auVar62._8_4_ = fVar3 + auVar57._8_4_;
            auVar62._12_4_ = fVar3 + auVar57._12_4_;
            auVar62._16_4_ = fVar3 + auVar57._16_4_;
            auVar62._20_4_ = fVar3 + auVar57._20_4_;
            auVar62._24_4_ = fVar3 + auVar57._24_4_;
            auVar62._28_4_ = fVar3 + auVar57._28_4_;
            uVar24 = vcmpps_avx512vl(ZEXT1632(auVar28),auVar62,6);
            uVar25 = vcmpps_avx512vl(ZEXT1632(auVar32),auVar17,1);
            uVar26 = vcmpps_avx512vl(ZEXT1632(auVar29),auVar58,6);
            bVar44 = ~((byte)uVar24 | (byte)uVar22 | (byte)uVar26 | (byte)uVar21 |
                      (byte)uVar23 | (byte)uVar25) & (byte)uVar20;
            This = (Intersectors *)(ulong)bVar44;
            if (((uint)uVar45 & 7) == 6) {
              uVar20 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar38 + 0x1e0),1);
              uVar21 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar38 + 0x1c0),0xd);
              This = (Intersectors *)(ulong)((byte)uVar20 & (byte)uVar21 & bVar44);
            }
          }
          if ((uVar45 & 8) == 0) {
            if (This == (Intersectors *)0x0) {
              iVar37 = 4;
            }
            else {
              auVar49 = *(undefined1 (*) [32])(uVar45 & 0xfffffffffffffff0);
              auVar18 = ((undefined1 (*) [32])(uVar45 & 0xfffffffffffffff0))[1];
              auVar62 = in_ZMM7._0_32_;
              auVar46 = vpternlogd_avx512vl(auVar65._0_32_,auVar62,auVar66._0_32_,0xf8);
              uVar45 = (ulong)This & 0xffffffff;
              auVar47 = vpcompressd_avx512vl(auVar46);
              bVar35 = (bool)((byte)uVar45 & 1);
              auVar48._0_4_ = (uint)bVar35 * auVar47._0_4_ | (uint)!bVar35 * auVar46._0_4_;
              bVar35 = (bool)((byte)(uVar45 >> 1) & 1);
              auVar48._4_4_ = (uint)bVar35 * auVar47._4_4_ | (uint)!bVar35 * auVar46._4_4_;
              bVar35 = (bool)((byte)(uVar45 >> 2) & 1);
              auVar48._8_4_ = (uint)bVar35 * auVar47._8_4_ | (uint)!bVar35 * auVar46._8_4_;
              bVar35 = (bool)((byte)(uVar45 >> 3) & 1);
              auVar48._12_4_ = (uint)bVar35 * auVar47._12_4_ | (uint)!bVar35 * auVar46._12_4_;
              bVar35 = (bool)((byte)(uVar45 >> 4) & 1);
              auVar48._16_4_ = (uint)bVar35 * auVar47._16_4_ | (uint)!bVar35 * auVar46._16_4_;
              bVar35 = (bool)((byte)(uVar45 >> 5) & 1);
              auVar48._20_4_ = (uint)bVar35 * auVar47._20_4_ | (uint)!bVar35 * auVar46._20_4_;
              bVar35 = (bool)((byte)(uVar45 >> 6) & 1);
              auVar48._24_4_ = (uint)bVar35 * auVar47._24_4_ | (uint)!bVar35 * auVar46._24_4_;
              bVar35 = (bool)((byte)(uVar45 >> 7) & 1);
              auVar48._28_4_ = (uint)bVar35 * auVar47._28_4_ | (uint)!bVar35 * auVar46._28_4_;
              auVar46 = vpermt2q_avx512vl(auVar49,auVar48,auVar18);
              uVar45 = auVar46._0_8_;
              iVar37 = 0;
              uVar38 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
              if (uVar38 != 0) {
                auVar46 = vpshufd_avx2(auVar48,0x55);
                vpermt2q_avx512vl(auVar49,auVar46,auVar18);
                auVar47 = vpminsd_avx2(auVar48,auVar46);
                auVar46 = vpmaxsd_avx2(auVar48,auVar46);
                uVar38 = uVar38 - 1 & uVar38;
                if (uVar38 == 0) {
                  auVar47 = vpermi2q_avx512vl(auVar47,auVar49,auVar18);
                  uVar45 = auVar47._0_8_;
                  auVar49 = vpermt2q_avx512vl(auVar49,auVar46,auVar18);
                  *puVar40 = auVar49._0_8_;
                  auVar49 = vpermd_avx2(auVar46,auVar62);
                  *(int *)(puVar40 + 1) = auVar49._0_4_;
                  puVar40 = puVar40 + 2;
                }
                else {
                  auVar56 = vpshufd_avx2(auVar48,0xaa);
                  vpermt2q_avx512vl(auVar49,auVar56,auVar18);
                  auVar52 = vpminsd_avx2(auVar47,auVar56);
                  auVar47 = vpmaxsd_avx2(auVar47,auVar56);
                  auVar56 = vpminsd_avx2(auVar46,auVar47);
                  auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                  uVar38 = uVar38 - 1 & uVar38;
                  if (uVar38 == 0) {
                    auVar47 = vpermi2q_avx512vl(auVar52,auVar49,auVar18);
                    uVar45 = auVar47._0_8_;
                    auVar47 = vpermt2q_avx512vl(auVar49,auVar46,auVar18);
                    *puVar40 = auVar47._0_8_;
                    auVar46 = vpermd_avx2(auVar46,auVar62);
                    *(int *)(puVar40 + 1) = auVar46._0_4_;
                    auVar49 = vpermt2q_avx512vl(auVar49,auVar56,auVar18);
                    puVar40[2] = auVar49._0_8_;
                    auVar49 = vpermd_avx2(auVar56,auVar62);
                    *(int *)(puVar40 + 3) = auVar49._0_4_;
                    puVar40 = puVar40 + 4;
                  }
                  else {
                    auVar47 = vpshufd_avx2(auVar48,0xff);
                    vpermt2q_avx512vl(auVar49,auVar47,auVar18);
                    auVar51 = vpminsd_avx2(auVar52,auVar47);
                    auVar47 = vpmaxsd_avx2(auVar52,auVar47);
                    auVar52 = vpminsd_avx2(auVar56,auVar47);
                    auVar47 = vpmaxsd_avx2(auVar56,auVar47);
                    auVar56 = vpminsd_avx2(auVar46,auVar47);
                    auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                    uVar38 = uVar38 - 1 & uVar38;
                    if (uVar38 == 0) {
                      auVar47 = vpermi2q_avx512vl(auVar51,auVar49,auVar18);
                      uVar45 = auVar47._0_8_;
                      auVar47 = vpermt2q_avx512vl(auVar49,auVar46,auVar18);
                      *puVar40 = auVar47._0_8_;
                      auVar46 = vpermd_avx2(auVar46,auVar62);
                      *(int *)(puVar40 + 1) = auVar46._0_4_;
                      auVar46 = vpermt2q_avx512vl(auVar49,auVar56,auVar18);
                      puVar40[2] = auVar46._0_8_;
                      auVar46 = vpermd_avx2(auVar56,auVar62);
                      *(int *)(puVar40 + 3) = auVar46._0_4_;
                      auVar49 = vpermt2q_avx512vl(auVar49,auVar52,auVar18);
                      puVar40[4] = auVar49._0_8_;
                      auVar49 = vpermd_avx2(auVar52,auVar62);
                      *(int *)(puVar40 + 5) = auVar49._0_4_;
                      puVar40 = puVar40 + 6;
                    }
                    else {
                      auVar50 = valignd_avx512vl(auVar48,auVar48,3);
                      auVar47 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar51 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar47,auVar51);
                      auVar47 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar52 = vpermt2d_avx512vl(auVar51,auVar47,auVar52);
                      auVar52 = vpermt2d_avx512vl(auVar52,auVar47,auVar56);
                      auVar47 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar46 = vpermt2d_avx512vl(auVar52,auVar47,auVar46);
                      auVar60 = ZEXT3264(auVar46);
                      uVar45 = uVar38;
                      do {
                        auVar47 = auVar60._0_32_;
                        auVar59._8_4_ = 1;
                        auVar59._0_8_ = 0x100000001;
                        auVar59._12_4_ = 1;
                        auVar59._16_4_ = 1;
                        auVar59._20_4_ = 1;
                        auVar59._24_4_ = 1;
                        auVar59._28_4_ = 1;
                        auVar46 = vpermd_avx2(auVar59,auVar50);
                        auVar50 = valignd_avx512vl(auVar50,auVar50,1);
                        vpermt2q_avx512vl(auVar49,auVar50,auVar18);
                        uVar45 = uVar45 - 1 & uVar45;
                        uVar20 = vpcmpd_avx512vl(auVar46,auVar47,5);
                        auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                        bVar44 = (byte)uVar20 << 1;
                        auVar47 = valignd_avx512vl(auVar47,auVar47,7);
                        bVar35 = (bool)((byte)uVar20 & 1);
                        auVar53._4_4_ = (uint)bVar35 * auVar47._4_4_ | (uint)!bVar35 * auVar46._4_4_
                        ;
                        auVar53._0_4_ = auVar46._0_4_;
                        bVar35 = (bool)(bVar44 >> 2 & 1);
                        auVar53._8_4_ = (uint)bVar35 * auVar47._8_4_ | (uint)!bVar35 * auVar46._8_4_
                        ;
                        bVar35 = (bool)(bVar44 >> 3 & 1);
                        auVar53._12_4_ =
                             (uint)bVar35 * auVar47._12_4_ | (uint)!bVar35 * auVar46._12_4_;
                        bVar35 = (bool)(bVar44 >> 4 & 1);
                        auVar53._16_4_ =
                             (uint)bVar35 * auVar47._16_4_ | (uint)!bVar35 * auVar46._16_4_;
                        bVar35 = (bool)(bVar44 >> 5 & 1);
                        auVar53._20_4_ =
                             (uint)bVar35 * auVar47._20_4_ | (uint)!bVar35 * auVar46._20_4_;
                        bVar35 = (bool)(bVar44 >> 6 & 1);
                        auVar53._24_4_ =
                             (uint)bVar35 * auVar47._24_4_ | (uint)!bVar35 * auVar46._24_4_;
                        auVar53._28_4_ =
                             (uint)(bVar44 >> 7) * auVar47._28_4_ |
                             (uint)!(bool)(bVar44 >> 7) * auVar46._28_4_;
                        auVar60 = ZEXT3264(auVar53);
                      } while (uVar45 != 0);
                      lVar39 = POPCOUNT(uVar38) + 3;
                      do {
                        auVar46 = vpermi2q_avx512vl(auVar53,auVar49,auVar18);
                        *puVar40 = auVar46._0_8_;
                        auVar47 = auVar60._0_32_;
                        auVar46 = vpermd_avx2(auVar47,auVar62);
                        *(int *)(puVar40 + 1) = auVar46._0_4_;
                        auVar53 = valignd_avx512vl(auVar47,auVar47,1);
                        puVar40 = puVar40 + 2;
                        auVar60 = ZEXT3264(auVar53);
                        lVar39 = lVar39 + -1;
                      } while (lVar39 != 0);
                      auVar49 = vpermt2q_avx512vl(auVar49,auVar53,auVar18);
                      uVar45 = auVar49._0_8_;
                    }
                    in_ZMM7 = ZEXT3264(auVar62);
                    iVar37 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar37 = 6;
          }
        } while (iVar37 == 0);
      } while ((iVar37 != 6) || (uVar38 = (ulong)((uint)uVar45 & 0xf), uVar38 == 8));
      lVar39 = (uVar45 & 0xfffffffffffffff0) + 0x50;
      lVar43 = 0;
      bVar44 = 0;
      do {
        bVar41 = 0;
        lVar42 = 0;
        do {
          if (*(int *)(lVar39 + lVar42 * 4) == -1) break;
          uVar8 = *(uint *)(lVar39 + -0x10 + lVar42 * 4);
          this = (context->scene->geometries).items[uVar8].ptr;
          context->geomID = uVar8;
          context->primID = *(uint *)(lVar39 + lVar42 * 4);
          bVar35 = Geometry::pointQuery(this,query,context);
          bVar41 = bVar41 | bVar35;
          lVar42 = lVar42 + 1;
        } while (lVar42 != 4);
        bVar44 = bVar44 | bVar41;
        lVar43 = lVar43 + 1;
        lVar39 = lVar39 + 0x60;
      } while (lVar43 != uVar38 - 8);
      auVar64 = ZEXT1664(auVar63);
      auVar49 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar65 = ZEXT3264(auVar49);
      auVar66 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
    } while (bVar44 == 0);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar54._4_4_ = uVar5;
    auVar54._0_4_ = uVar5;
    auVar54._8_4_ = uVar5;
    auVar54._12_4_ = uVar5;
    auVar54._16_4_ = uVar5;
    auVar54._20_4_ = uVar5;
    auVar54._24_4_ = uVar5;
    auVar54._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar57._4_4_ = uVar5;
    auVar57._0_4_ = uVar5;
    auVar57._8_4_ = uVar5;
    auVar57._12_4_ = uVar5;
    auVar57._16_4_ = uVar5;
    auVar57._20_4_ = uVar5;
    auVar57._24_4_ = uVar5;
    auVar57._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar49._4_4_ = uVar5;
    auVar49._0_4_ = uVar5;
    auVar49._8_4_ = uVar5;
    auVar49._12_4_ = uVar5;
    auVar49._16_4_ = uVar5;
    auVar49._20_4_ = uVar5;
    auVar49._24_4_ = uVar5;
    auVar49._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar64 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar7 = (context->query_radius).field_0;
      auVar63 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar64 = ZEXT1664(auVar63);
    }
    bVar36 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }